

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<void> __thiscall kj::HttpServer::drain(HttpServer *this)

{
  SourceLocation location;
  bool bVar1;
  PromiseFulfiller<void> *pPVar2;
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *t;
  Promise<void> *pPVar3;
  long in_RSI;
  undefined8 in_stack_ffffffffffffff60;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *this_00;
  Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> local_80;
  SourceLocation local_68;
  undefined1 local_50 [8];
  PromiseFulfillerPair<void> paf;
  Fault local_28;
  Fault f;
  DebugExpression<bool> _kjCondition;
  HttpServer *this_local;
  
  f.exception._6_1_ = (*(byte *)(in_RSI + 0x70) ^ 0xff) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x1fcb,FAILED,"!draining","_kjCondition,\"you can only call drain() once\"",
               (DebugExpression<bool> *)((long)&f.exception + 7),
               (char (*) [31])"you can only call drain() once");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  *(undefined1 *)(in_RSI + 0x70) = 1;
  pPVar2 = Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator->
                     ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x88));
  (*(pPVar2->super_PromiseRejector)._vptr_PromiseRejector[2])
            (pPVar2,(undefined1 *)((long)&paf.fulfiller.ptr + 3));
  if (*(int *)(in_RSI + 0x98) == 0) {
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    SourceLocation::SourceLocation
              (&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"drain",0x1fd3,0x10);
    location.function = (char *)local_68._16_8_;
    location.fileName = local_68.function;
    location.lineNumber = (int)in_stack_ffffffffffffff60;
    location.columnNumber = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    newPromiseAndFulfiller<void>(location);
    t = mv<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>
                  ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)&paf);
    this_00 = &local_80;
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::Maybe(this_00,t);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::operator=
              ((Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)(in_RSI + 0xa0),
               this_00);
    Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>::~Maybe(&local_80);
    pPVar3 = mv<kj::Promise<void>>((Promise<void> *)local_50);
    Promise<void>::Promise((Promise<void> *)this,pPVar3);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair((PromiseFulfillerPair<void> *)local_50);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> HttpServer::drain() {
  KJ_REQUIRE(!draining, "you can only call drain() once");

  draining = true;
  drainFulfiller->fulfill();

  if (connectionCount == 0) {
    return kj::READY_NOW;
  } else {
    auto paf = kj::newPromiseAndFulfiller<void>();
    zeroConnectionsFulfiller = kj::mv(paf.fulfiller);
    return kj::mv(paf.promise);
  }
}